

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O0

int __thiscall QuantNet::save_table(QuantNet *this,char *tablepath)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar1;
  FILE *__stream;
  size_type sVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  undefined8 uVar6;
  float *pfVar7;
  char *in_RSI;
  long in_RDI;
  int j_1;
  Mat *bottom_blob_scale;
  int i_1;
  int j;
  Mat *weight_scale;
  int i;
  int conv_bottom_blob_count;
  int conv_layer_count;
  FILE *fp;
  int local_4c;
  int local_40;
  int local_3c;
  int local_2c;
  int local_4;
  
  __stream = fopen(in_RSI,"wb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"fopen %s failed\n",in_RSI);
    local_4 = -1;
  }
  else {
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf8));
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x110));
    for (local_2c = 0; local_2c < (int)sVar2; local_2c = local_2c + 1) {
      pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                         ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(in_RDI + 0x158),
                          (long)local_2c);
      pvVar1 = *(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf8),(long)local_2c);
      std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[](pvVar1,(long)*pvVar5);
      uVar6 = std::__cxx11::string::c_str();
      fprintf(__stream,"%s_param_0 ",uVar6);
      for (local_3c = 0; local_3c < pvVar4->w; local_3c = local_3c + 1) {
        pfVar7 = ncnn::Mat::operator[](pvVar4,(long)local_3c);
        fprintf(__stream,"%f ",(double)*pfVar7);
      }
      fprintf(__stream,"\n");
    }
    for (local_40 = 0; local_40 < (int)sVar3; local_40 = local_40 + 1) {
      pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                         ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(in_RDI + 0x170),
                          (long)local_40);
      pvVar1 = *(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf8),(long)local_40);
      std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[](pvVar1,(long)*pvVar5);
      uVar6 = std::__cxx11::string::c_str();
      fprintf(__stream,"%s ",uVar6);
      for (local_4c = 0; local_4c < pvVar4->w; local_4c = local_4c + 1) {
        pfVar7 = ncnn::Mat::operator[](pvVar4,(long)local_4c);
        fprintf(__stream,"%f ",(double)*pfVar7);
      }
      fprintf(__stream,"\n");
    }
    fclose(__stream);
    fprintf(_stderr,
            "ncnn int8 calibration table create success, best wish for your int8 inference has a low accuracy loss...\\(^0^)/...233...\n"
           );
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int QuantNet::save_table(const char* tablepath)
{
    FILE* fp = fopen(tablepath, "wb");
    if (!fp)
    {
        fprintf(stderr, "fopen %s failed\n", tablepath);
        return -1;
    }

    const int conv_layer_count = (int)conv_layers.size();
    const int conv_bottom_blob_count = (int)conv_bottom_blobs.size();

    for (int i = 0; i < conv_layer_count; i++)
    {
        const ncnn::Mat& weight_scale = weight_scales[i];

        fprintf(fp, "%s_param_0 ", layers[conv_layers[i]]->name.c_str());
        for (int j = 0; j < weight_scale.w; j++)
        {
            fprintf(fp, "%f ", weight_scale[j]);
        }
        fprintf(fp, "\n");
    }

    for (int i = 0; i < conv_bottom_blob_count; i++)
    {
        const ncnn::Mat& bottom_blob_scale = bottom_blob_scales[i];

        fprintf(fp, "%s ", layers[conv_layers[i]]->name.c_str());
        for (int j = 0; j < bottom_blob_scale.w; j++)
        {
            fprintf(fp, "%f ", bottom_blob_scale[j]);
        }
        fprintf(fp, "\n");
    }

    fclose(fp);

    fprintf(stderr, "ncnn int8 calibration table create success, best wish for your int8 inference has a low accuracy loss...\\(^0^)/...233...\n");

    return 0;
}